

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-spbset.c
# Opt level: O1

_Bool Curl_uint_spbset_empty(uint_spbset *bset)

{
  long lVar1;
  bool bVar2;
  
  do {
    bVar2 = &bset->head == (uint_spbset_chunk *)0x0;
    if (bVar2) {
      return bVar2;
    }
    lVar1 = 1;
    do {
      if ((bset->head).slots[lVar1 + -1] != 0) {
        return bVar2;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 5);
    bset = (uint_spbset *)((uint_spbset_chunk *)&(bset->head).next)->next;
  } while( true );
}

Assistant:

bool Curl_uint_spbset_empty(struct uint_spbset *bset)
{
  struct uint_spbset_chunk *chunk;
  unsigned int i;

  for(chunk = &bset->head; chunk; chunk = chunk->next) {
    for(i = 0; i < CURL_UINT_SPBSET_CH_SLOTS; ++i) {
      if(chunk->slots[i])
        return FALSE;
    }
  }
  return TRUE;
}